

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  long lVar1;
  ImGuiWindow_conflict *pIVar2;
  ImDrawList *this;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 *pIVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  ImU32 col_upr_right;
  ImU32 IVar8;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ImVec2 IVar9;
  undefined7 extraout_var_00;
  ImVec2 *pIVar10;
  char cVar11;
  ImGuiContext_conflict1 *pIVar12;
  long lVar13;
  uint uVar14;
  byte bVar15;
  ImU32 IVar16;
  ImGuiContext *g;
  ImGuiContext_conflict1 *out_h;
  ulong uVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  float extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  int iVar22;
  ImVec2 p_min;
  ImVec2 pos;
  int extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar21;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float fVar23;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max_01;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  float fVar24;
  float fVar25;
  float fVar26;
  float S;
  float V;
  ImVec2 picker_pos;
  ImVec2 wheel_center;
  float B;
  float G;
  float R;
  ImU32 col_hues [7];
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float vv;
  ImVec2 sv_cursor_pos;
  ImVec2 tra;
  ImVec4 hue_color_f;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  undefined1 local_238 [8];
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  ImVec2 *local_220;
  ImVec2 local_218;
  float local_20c;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  ImVec2 local_1ec;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [8];
  uint uStack_1d0;
  uint uStack_1cc;
  ImVec2 local_1c8;
  float local_1c0;
  float local_1bc;
  int local_1b8;
  int local_1b4;
  float local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  uint uStack_19c;
  ImU32 local_18c;
  float local_188;
  uint local_184;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  undefined1 local_168 [16];
  ImGuiContext_conflict1 *local_150;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [12];
  float fStack_12c;
  float local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  ImVec2 local_110;
  undefined1 local_108 [16];
  ImVec2 local_f8;
  ImVec2 local_e8;
  ImU32 local_dc;
  ImVec4 local_d8;
  float local_c8;
  bool abStack_c4 [12];
  size_t local_b8;
  ulong local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar12 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems != false) {
    bVar15 = 0;
    goto LAB_001f26af;
  }
  this = pIVar2->DrawList;
  local_148 = ref_col;
  local_208._0_4_ = CalcItemWidth();
  local_208._4_4_ = extraout_XMM0_Db;
  uStack_200._0_4_ = (float)extraout_XMM0_Dc;
  uStack_200._4_4_ = extraout_XMM0_Dd;
  (pIVar12->NextItemData).Flags = 0;
  local_f8 = (ImVec2)label;
  PushID(label);
  BeginGroup();
  uVar14 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar14);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar7 = pIVar12->ColorEditOptions & 0x6000000;
    uVar19 = 0x2000000;
    if (uVar7 != 0) {
      uVar19 = uVar7;
    }
    uVar14 = uVar14 | uVar19;
  }
  if ((uVar14 & 0x18000000) == 0) {
    uVar7 = pIVar12->ColorEditOptions & 0x18000000;
    uVar19 = 0x8000000;
    if (uVar7 != 0) {
      uVar19 = uVar7;
    }
    uVar14 = uVar14 | uVar19;
  }
  uVar19 = (uVar14 & 0x6000000) - 1;
  if ((uVar14 & 0x6000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x13f7,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar19 = (uVar14 & 0x18000000) - 1;
  if ((uVar14 & 0x18000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x13f8,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar14 & 8) == 0) {
    uVar14 = uVar14 | pIVar12->ColorEditOptions & 0x10000U;
  }
  local_184 = uVar14 & 0x10002;
  bVar18 = local_184 == 0x10000;
  local_218 = (pIVar2->DC).CursorPos;
  local_220 = (ImVec2 *)col;
  local_128 = GetFrameHeight();
  pIVar10 = local_220;
  fVar23 = (pIVar12->Style).ItemInnerSpacing.x;
  local_108 = ZEXT416((uint)fVar23);
  fVar24 = (float)local_208._0_4_ - (local_128 + fVar23) * (float)(byte)(bVar18 + 1);
  uVar19 = -(uint)(fVar24 <= local_128);
  fStack_1a4 = (float)(local_208._4_4_ & extraout_XMM0_Db_00);
  fStack_1a0 = (float)((uint)(float)uStack_200 & extraout_XMM0_Dc_00);
  uStack_19c = uStack_200._4_4_ & extraout_XMM0_Dd_00;
  local_1a8 = (float)(uVar19 & (uint)local_128 | ~uVar19 & (uint)fVar24);
  local_208._0_4_ = local_218.x;
  _local_1d8 = ZEXT416((uint)(local_218.x + local_1a8 + fVar23));
  local_b8 = (ulong)((uVar14 & 2) == 0) * 4 + 0xc;
  uStack_124 = extraout_XMM0_Db_00;
  uStack_120 = extraout_XMM0_Dc_00;
  uStack_11c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_220,local_b8);
  local_20c = local_1a8 * 0.08;
  local_a8 = local_1a8 * 0.5;
  local_1ec.x = (local_128 + local_1a8) * 0.5 + (float)local_208._0_4_;
  fStack_a4 = fStack_1a4;
  fStack_a0 = fStack_1a0;
  uStack_9c = uStack_19c;
  local_1ec.y = local_218.y + local_a8;
  local_208._4_4_ = fStack_1a4;
  local_208._0_4_ = local_a8 - local_20c;
  uStack_200._0_4_ = fStack_1a0;
  uStack_200._4_4_ = uStack_19c;
  local_170.x = (local_a8 - local_20c) - (float)(int)(local_1a8 * 0.027);
  local_170.y = 0.0;
  local_180.x = local_170.x * -0.5;
  local_178.y = local_170.x * -0.866025;
  local_180.y = local_170.x * 0.866025;
  local_238._0_4_ = pIVar10->x;
  local_230 = pIVar10->y;
  local_22c = pIVar10[1].x;
  local_150 = pIVar12;
  local_1e4 = local_22c;
  local_1e0 = local_230;
  local_1dc = (float)local_238._0_4_;
  local_178.x = local_180.x;
  if ((uVar14 >> 0x1b & 1) == 0) {
    out_h = pIVar12;
    if ((uVar14 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB
                ((float)local_238._0_4_,local_230,local_22c,&local_1dc,&local_1e0,&local_1e4);
    }
  }
  else {
    out_h = (ImGuiContext_conflict1 *)local_238;
    ColorConvertRGBtoHSV
              ((float)local_238._0_4_,local_230,local_22c,(float *)out_h,&local_230,&local_22c);
    pIVar12 = local_150;
    ColorEditRestoreHS(&pIVar10->x,(float *)out_h,&local_230,&local_22c);
  }
  local_168._4_4_ = uStack_124;
  local_168._0_4_ = local_128 + (float)local_1d8._0_4_;
  local_168._8_4_ = uStack_120;
  local_168._12_4_ = uStack_11c;
  PushItemFlag(8,true);
  if ((uVar14 >> 0x1a & 1) == 0) {
    if ((uVar14 >> 0x19 & 1) == 0) {
      local_224 = 0.0;
      local_228 = 0.0;
      uVar17 = 0;
    }
    else {
      local_1c8.y = local_1a8;
      local_1c8.x = local_1a8;
      local_224 = 0.0;
      InvisibleButton("sv",&local_1c8,0);
      bVar18 = IsItemActive();
      if (bVar18) {
        fVar23 = ((pIVar12->IO).MousePos.x - local_218.x) / (local_1a8 + -1.0);
        local_230 = 1.0;
        if (fVar23 <= 1.0) {
          local_230 = fVar23;
        }
        local_230 = (float)(~-(uint)(fVar23 < 0.0) & (uint)local_230);
        fVar24 = ((pIVar12->IO).MousePos.y - local_218.y) / (local_1a8 + -1.0);
        fVar23 = 1.0;
        if (fVar24 <= 1.0) {
          fVar23 = fVar24;
        }
        local_22c = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar23));
        IVar16 = pIVar12->ColorEditLastColor;
        local_1c8 = *local_220;
        local_1c0 = local_220[1].x;
        local_1bc = 0.0;
        pIVar10 = local_220;
        IVar8 = ColorConvertFloat4ToU32((ImVec4 *)&local_1c8);
        local_224 = (float)CONCAT71((int7)((ulong)pIVar10 >> 8),1);
        if (IVar16 == IVar8) {
          local_238._0_4_ = pIVar12->ColorEditLastHue;
        }
      }
      if ((uVar14 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_1c8.y = local_218.y;
      local_1c8.x = (float)local_1d8._0_4_;
      SetCursorScreenPos(&local_1c8);
      local_1c8.y = local_1a8;
      local_1c8.x = local_128;
      local_228 = 0.0;
      InvisibleButton("hue",&local_1c8,0);
      bVar18 = IsItemActive();
      if (bVar18) {
        fVar23 = ((pIVar12->IO).MousePos.y - local_218.y) / (local_1a8 + -1.0);
        local_238._0_4_ = 1.0;
        if (fVar23 <= 1.0) {
          local_238._0_4_ = fVar23;
        }
        local_238._0_4_ = ~-(uint)(fVar23 < 0.0) & local_238._0_4_;
        local_228 = (float)CONCAT71(extraout_var,1);
        uVar17 = CONCAT71((int7)((ulong)out_h >> 8),1);
      }
      else {
        uVar17 = (ulong)(uint)local_224;
      }
    }
  }
  else {
    local_1c8.y = local_1a8;
    local_1c8.x = (pIVar12->Style).ItemInnerSpacing.x + local_1a8 + local_128;
    local_224 = 0.0;
    InvisibleButton("hsv",&local_1c8,0);
    bVar18 = IsItemActive();
    local_228 = 0.0;
    uVar17 = 0;
    if (bVar18) {
      fVar24 = (pIVar12->IO).MouseClickedPos[0].x - local_1ec.x;
      local_78 = ZEXT416((uint)fVar24);
      local_c8 = (pIVar12->IO).MouseClickedPos[0].y - local_1ec.y;
      fVar23 = (pIVar12->IO).MousePos.x - local_1ec.x;
      _local_88 = ZEXT416((uint)fVar23);
      local_238._4_4_ = (pIVar12->IO).MousePos.y - local_1ec.y;
      fVar24 = fVar24 * fVar24 + local_c8 * local_c8;
      if ((fVar24 < ((float)local_208._0_4_ + -1.0) * ((float)local_208._0_4_ + -1.0)) ||
         ((local_a8 + 1.0) * (local_a8 + 1.0) < fVar24)) {
        local_228 = 0.0;
      }
      else {
        fVar23 = atan2f((float)local_238._4_4_,fVar23);
        fVar23 = (fVar23 / 3.1415927) * 0.5;
        local_238._0_4_ =
             ~-(uint)(fVar23 < 0.0) & (uint)fVar23 | (uint)(fVar23 + 1.0) & -(uint)(fVar23 < 0.0);
        local_228 = (float)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_98._0_4_ = cosf((float)local_238._0_4_ * -2.0 * 3.1415927);
      fVar23 = sinf((float)local_238._0_4_ * -2.0 * 3.1415927);
      local_1c8.x = (float)local_78._0_4_ * (float)local_98._0_4_ - fVar23 * local_c8;
      local_1c8.y = (float)local_78._0_4_ * fVar23 + local_c8 * (float)local_98._0_4_;
      local_c8 = fVar23;
      bVar18 = ImTriangleContainsPoint(&local_170,&local_178,&local_180,&local_1c8);
      if (bVar18) {
        local_1c8.x = (float)local_88._0_4_ * (float)local_98._0_4_ -
                      local_c8 * (float)local_238._4_4_;
        local_1c8.y = (float)local_88._0_4_ * local_c8 +
                      (float)local_238._4_4_ * (float)local_98._0_4_;
        bVar18 = ImTriangleContainsPoint(&local_170,&local_178,&local_180,&local_1c8);
        if (!bVar18) {
          local_1c8 = ImTriangleClosestPoint(&local_170,&local_178,&local_180,&local_1c8);
        }
        ImTriangleBarycentricCoords
                  (&local_170,&local_178,&local_180,&local_1c8,&local_d8.x,(float *)local_138,
                   &local_110.x);
        fVar24 = 1.0 - (float)local_138._0_4_;
        fVar23 = 1.0;
        if (fVar24 <= 1.0) {
          fVar23 = fVar24;
        }
        local_22c = (float)(-(uint)(fVar24 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar24 < 0.0001) & (uint)fVar23);
        fVar24 = local_d8.x / local_22c;
        fVar23 = 1.0;
        if (fVar24 <= 1.0) {
          fVar23 = fVar24;
        }
        local_230 = (float)(-(uint)(fVar24 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar24 < 0.0001) & (uint)fVar23);
        local_224 = (float)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar17 = 1;
      }
      else {
        local_224 = 0.0;
        uVar17 = (ulong)(uint)local_228;
      }
    }
    if ((uVar14 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_108._0_4_ = (float)local_108._0_4_ + (float)local_168._0_4_;
  if (local_184 == 0x10000) {
    local_1c8.y = local_218.y;
    local_1c8.x = (float)local_108._0_4_;
    SetCursorScreenPos(&local_1c8);
    local_1c8.y = local_1a8;
    local_1c8.x = local_128;
    InvisibleButton("alpha",&local_1c8,0);
    bVar18 = IsItemActive();
    if (bVar18) {
      fVar24 = ((pIVar12->IO).MousePos.y - local_218.y) / (local_1a8 + -1.0);
      fVar23 = 1.0;
      if (fVar24 <= 1.0) {
        fVar23 = fVar24;
      }
      local_220[1].y =
           (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                  ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar23));
      uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
    }
  }
  uVar19 = (uint)uVar17;
  PopItemFlag();
  if ((uVar14 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar12->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  IVar21 = local_f8;
  if ((-1 < (char)uVar14) &&
     (IVar9 = (ImVec2)FindRenderedTextEnd((char *)local_f8,(char *)0x0), IVar9 != IVar21)) {
    if ((uVar14 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar12->Style).ItemInnerSpacing.x);
    }
    TextEx((char *)local_f8,(char *)IVar9,0);
  }
  if ((uVar14 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_1c8 = *local_220;
    local_1c0 = local_220[1].x;
    if ((uVar14 & 2) == 0) {
      local_1bc = local_220[1].y;
    }
    else {
      local_1bc = 1.0;
    }
    if ((char)uVar14 < '\0') {
      Text("Current");
    }
    local_f8.x = local_128 * 3.0;
    local_f8.y = local_128 + local_128;
    local_e8 = (ImVec2)((ulong)uStack_124 << 0x20);
    ColorButton("##current",(ImVec4 *)&local_1c8,uVar14 & 0x180e0040,local_f8);
    if (local_148 != (float *)0x0) {
      Text("Original");
      local_d8.x = local_148[0];
      local_d8.y = local_148[1];
      local_d8.z = local_148[2];
      if ((uVar14 & 2) == 0) {
        local_d8.w = local_148[3];
      }
      else {
        local_d8.w = 1.0;
      }
      bVar18 = ColorButton("##original",&local_d8,uVar14 & 0x180e0040,local_f8);
      if (bVar18) {
        memcpy(local_220,local_148,local_b8);
        uVar19 = (uint)CONCAT71((int7)(uVar17 >> 8),1);
      }
    }
    local_238._4_4_ = uVar19;
    PopItemFlag();
    EndGroup();
    uVar19 = local_238._4_4_;
  }
  local_238._4_4_ = uVar19;
  pIVar5 = local_220;
  out_g = &local_220->y;
  pIVar10 = local_220 + 1;
  if ((local_228._0_1_ != '\0') || (local_224._0_1_ != '\0')) {
    if ((uVar14 >> 0x1b & 1) == 0) {
      if ((uVar14 >> 0x1c & 1) != 0) {
        local_220->x = (float)local_238._0_4_;
        local_220->y = local_230;
        local_220[1].x = local_22c;
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)local_238._0_4_,local_230,local_22c,&local_220->x,out_g,&pIVar10->x);
      pIVar12->ColorEditLastHue = (float)local_238._0_4_;
      pIVar12->ColorEditLastSat = local_230;
      local_1c8 = *pIVar5;
      local_1c0 = pIVar5[1].x;
      local_1bc = 0.0;
      IVar16 = ColorConvertFloat4ToU32((ImVec4 *)&local_1c8);
      pIVar12->ColorEditLastColor = IVar16;
    }
  }
  cVar11 = '\x01';
  fVar23 = local_128 * 0.2;
  fVar24 = 0.0;
  fVar25 = 0.0;
  fVar26 = 0.0;
  if ((uVar14 & 0x20) == 0) {
    local_148 = (float *)(ulong)(uint)(local_128 * 0.2);
    fStack_140 = 0.0;
    fStack_13c = 0.0;
    fVar23 = (float)local_108._0_4_;
    if (local_184 != 0x10000) {
      fVar23 = (float)local_1d8._0_4_;
    }
    PushItemWidth((fVar23 + local_128) - local_218.x);
    uVar19 = uVar14 & 0x198e001a;
    cVar11 = '\x01';
    if (((uVar14 >> 0x14 & 1) != 0 || (uVar14 & 0x600000) == 0) &&
       (bVar18 = ColorEdit4("##rgb",&local_220->x,uVar19 | 0x100004), bVar18)) {
      local_238._4_4_ = (undefined4)CONCAT71(extraout_var_00,1);
      if (local_150->ActiveId == 0) {
        cVar11 = '\x01';
      }
      else {
        cVar11 = local_150->ActiveIdAllowOverlap;
      }
    }
    if ((uVar14 >> 0x15 & 1) != 0 || (uVar14 & 0x500000) == 0) {
      bVar18 = ColorEdit4("##hsv",&local_220->x,uVar19 | 0x200004);
      local_238._4_4_ = CONCAT31(SUB43(local_238._4_4_,1),(byte)local_238._4_4_ | bVar18);
    }
    if ((uVar14 >> 0x16 & 1) != 0 || (uVar14 & 0x300000) == 0) {
      bVar18 = ColorEdit4("##hex",&local_220->x,uVar19 | 0x400004);
      local_238._4_4_ = CONCAT31(SUB43(local_238._4_4_,1),(byte)local_238._4_4_ | bVar18);
    }
    PopItemWidth();
    fVar23 = (float)local_148;
    fVar24 = local_148._4_4_;
    fVar25 = fStack_140;
    fVar26 = fStack_13c;
  }
  pIVar5 = local_220;
  iVar20 = (int)fVar23;
  iVar22 = (int)fVar24;
  fVar23 = (float)(int)fVar25;
  fVar24 = (float)(int)fVar26;
  if (((uVar14 >> 0x1b & 1) != 0) && (cVar11 == '\0')) {
    local_148 = (float *)CONCAT44(iVar22,iVar20);
    fStack_140 = fVar23;
    fStack_13c = fVar24;
    ColorConvertRGBtoHSV
              (local_220->x,local_220->y,local_220[1].x,&local_1c8.x,&local_d8.x,(float *)local_138)
    ;
    if ((local_1c8.x <= 0.0) && (0.0 < (float)local_238._0_4_)) {
      if (0.0 < (float)local_138._0_4_) {
LAB_001f1845:
        if (0.0 < local_d8.x) goto LAB_001f186b;
        fVar23 = local_230 * 0.5;
      }
      else {
        if ((local_22c == (float)local_138._0_4_) &&
           (!NAN(local_22c) && !NAN((float)local_138._0_4_))) goto LAB_001f1845;
        local_138._0_4_ = local_22c * 0.5;
        fVar23 = local_230;
      }
      ColorConvertHSVtoRGB
                ((float)local_238._0_4_,fVar23,(float)local_138._0_4_,&pIVar5->x,out_g,&pIVar10->x);
    }
LAB_001f186b:
    iVar20 = (int)(float)local_148;
    iVar22 = (int)local_148._4_4_;
    fVar23 = fStack_140;
    fVar24 = fStack_13c;
  }
  pIVar10 = local_220;
  uVar19 = local_238._4_4_;
  local_68 = (float)iVar20;
  fStack_64 = (float)iVar22;
  fStack_60 = (float)(int)fVar23;
  fStack_5c = (float)(int)fVar24;
  if ((char)local_238._4_4_ != '\0') {
    if ((uVar14 >> 0x1b & 1) == 0) {
      if ((uVar14 >> 0x1c & 1) != 0) {
        local_238._0_4_ = local_220->x;
        local_230 = local_220->y;
        local_22c = local_220[1].x;
        ColorConvertHSVtoRGB
                  ((float)local_238._0_4_,local_230,local_22c,&local_1dc,&local_1e0,&local_1e4);
      }
    }
    else {
      local_1dc = local_220->x;
      local_1e0 = local_220->y;
      local_1e4 = local_220[1].x;
      ColorConvertRGBtoHSV(local_1dc,local_1e0,local_1e4,(float *)local_238,&local_230,&local_22c);
      uVar19 = local_238._4_4_;
      ColorEditRestoreHS(&pIVar10->x,(float *)local_238,&local_230,&local_22c);
    }
  }
  pIVar12 = local_150;
  local_d8.w = (local_150->Style).Alpha;
  fVar23 = 1.0;
  if (local_d8.w <= 1.0) {
    fVar23 = local_d8.w;
  }
  local_d8.x = 1.0;
  local_d8.y = 1.0;
  local_d8.z = 1.0;
  uVar7 = (int)((float)(~-(uint)(local_d8.w < 0.0) & (uint)fVar23) * 255.0 + 0.5) * 0x1000000;
  local_b0 = (ulong)uVar7;
  local_1b8 = uVar7 + 0xff0000;
  local_1bc = (float)(uVar7 + 0xffff00);
  IVar16 = uVar7 + 0xffffff;
  local_1b0 = (float)(uVar7 + 0xff);
  local_1c8.y = (float)(uVar7 + 0xffff);
  local_1c8.x = local_1b0;
  local_1c0 = (float)(uVar7 + 0xff00);
  local_188 = (float)(uVar7 + 0x808080);
  local_1b4 = uVar7 + 0xff00ff;
  ColorConvertHSVtoRGB((float)local_238._0_4_,1.0,1.0,&local_d8.x,&local_d8.y,&local_d8.z);
  col_upr_right = ColorConvertFloat4ToU32(&local_d8);
  fStack_12c = (pIVar12->Style).Alpha;
  local_138._4_4_ = local_1e0;
  local_138._0_4_ = local_1dc;
  local_138._8_4_ = local_1e4;
  IVar8 = ColorConvertFloat4ToU32((ImVec4 *)local_138);
  local_110.x = 0.0;
  local_110.y = 0.0;
  if ((uVar14 >> 0x1a & 1) == 0) {
    if ((uVar14 >> 0x19 & 1) != 0) {
      local_138._0_4_ = local_218.x + local_1a8;
      local_138._4_4_ = local_218.y + local_1a8;
      local_148 = (float *)CONCAT44(local_148._4_4_,IVar16);
      local_18c = IVar8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_218,(ImVec2 *)local_138,IVar16,col_upr_right,col_upr_right,IVar16);
      local_138._0_4_ = local_218.x + local_1a8;
      local_138._4_4_ = local_218.y + local_1a8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_218,(ImVec2 *)local_138,0,0,(ImU32)local_b0,(ImU32)local_b0);
      IVar9.x = local_218.x + local_1a8;
      IVar9.y = local_218.y + local_1a8;
      RenderFrameBorder(local_218,IVar9,0.0);
      fVar23 = 1.0;
      if (local_230 <= 1.0) {
        fVar23 = local_230;
      }
      fVar24 = (float)(int)((float)(~-(uint)(local_230 < 0.0) & (uint)fVar23) * local_1a8 +
                            local_218.x + 0.5);
      fVar23 = local_1a8 + local_218.x + -2.0;
      if (fVar24 <= fVar23) {
        fVar23 = fVar24;
      }
      uVar14 = -(uint)(fVar24 < local_218.x + 2.0);
      fVar25 = 1.0 - local_22c;
      fVar24 = 1.0;
      if (fVar25 <= 1.0) {
        fVar24 = fVar25;
      }
      fVar25 = (float)(int)((float)(~-(uint)(fVar25 < 0.0) & (uint)fVar24) * local_1a8 + local_218.y
                           + 0.5);
      fVar24 = local_218.y + local_1a8 + -2.0;
      if (fVar25 <= fVar24) {
        fVar24 = fVar25;
      }
      uVar7 = -(uint)(fVar25 < local_218.y + 2.0);
      local_110.y = (float)(uVar7 & (uint)(local_218.y + 2.0) | ~uVar7 & (uint)fVar24);
      local_110.x = (float)(uVar14 & (uint)(local_218.x + 2.0) | ~uVar14 & (uint)fVar23);
      local_208._0_4_ = local_1a8 / 6.0;
      lVar13 = 0;
      do {
        lVar1 = lVar13 + 1;
        local_138._4_4_ = (float)(int)lVar13 * (float)local_208._0_4_ + local_218.y;
        local_138._0_4_ = local_1d8._0_4_;
        local_e8.y = (float)(int)lVar1 * (float)local_208._0_4_ + local_218.y;
        local_e8.x = (float)local_168._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_138,&local_e8,(ImU32)(&local_1c8.x)[lVar13],
                   (ImU32)(&local_1c8.x)[lVar13],(ImU32)(&local_1c8.y)[lVar13],
                   (ImU32)(&local_1c8.y)[lVar13]);
        lVar13 = lVar1;
      } while (lVar1 != 6);
      _local_208 = ZEXT416((uint)(float)(int)((float)local_238._0_4_ * local_1a8 + local_218.y + 0.5
                                             ));
      p_min.y = local_218.y;
      p_min.x = (float)local_1d8._0_4_;
      p_max_01.y = local_1a8 + local_218.y;
      p_max_01.x = (float)local_168._0_4_;
      RenderFrameBorder(p_min,p_max_01,0.0);
      pos.x = (float)local_1d8._0_4_ + -1.0;
      pos.y = (float)local_208._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(this,pos,half_sz,local_128 + 2.0,(local_150->Style).Alpha);
      IVar16 = (ImU32)(float)local_148;
      IVar8 = local_18c;
    }
  }
  else {
    local_98 = ZEXT416((uint)(0.5 / local_a8));
    iVar20 = 4;
    if (4 < (int)local_a8 / 0xc) {
      iVar20 = (int)local_a8 / 0xc;
    }
    local_78._0_4_ = iVar20;
    local_c8 = -(0.5 / local_a8);
    abStack_c4[0] = false;
    abStack_c4[1] = false;
    abStack_c4[2] = false;
    abStack_c4[3] = true;
    abStack_c4[4] = false;
    abStack_c4[5] = false;
    abStack_c4[6] = false;
    abStack_c4[7] = true;
    abStack_c4[8] = false;
    abStack_c4[9] = false;
    abStack_c4[10] = false;
    abStack_c4[0xb] = true;
    local_a8 = local_a8 + (float)local_208._0_4_;
    local_88._4_4_ = fStack_a4;
    local_88._0_4_ = local_a8 * 0.5;
    fStack_80 = fStack_a0;
    uStack_7c = uStack_9c;
    lVar13 = 0;
    local_18c = IVar8;
    local_dc = col_upr_right;
    do {
      fVar23 = (float)(int)lVar13 / 6.0;
      fVar23 = (fVar23 + fVar23) * 3.1415927 + local_c8;
      local_168._0_4_ = fVar23;
      fVar24 = ((float)(int)lVar13 + 1.0) / 6.0;
      fVar24 = (fVar24 + fVar24) * 3.1415927 + (float)local_98._0_4_;
      local_148 = (float *)CONCAT44(local_148._4_4_,fVar24);
      iVar20 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1ec,(float)local_88._0_4_,fVar23,fVar24,local_78._0_4_);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,IVar16,0,local_20c);
      (this->_Path).Size = 0;
      iVar22 = (this->VtxBuffer).Size;
      local_1d8._0_4_ = local_1ec.x;
      fVar23 = cosf((float)local_168._0_4_);
      local_1d8._4_4_ = extraout_XMM0_Db_01;
      local_1d8._0_4_ = fVar23 * (float)local_208._0_4_ + (float)local_1d8._0_4_;
      uStack_1d0 = extraout_XMM0_Dc_01;
      uStack_1cc = extraout_XMM0_Dd_01;
      local_f8.x = local_1ec.y;
      fVar23 = sinf((float)local_168._0_4_);
      uStack_1d0 = local_1d8._4_4_;
      local_1d8._4_4_ = fVar23 * (float)local_208._0_4_ + local_f8.x;
      uStack_1cc = extraout_XMM0_Db_02;
      local_168 = ZEXT416((uint)local_1ec.x);
      fVar23 = cosf((float)local_148);
      local_168._0_4_ = (float)local_168._0_4_ + fVar23 * (float)local_208._0_4_;
      local_f8.x = local_1ec.y;
      fVar23 = sinf((float)local_148);
      IVar21.y = fVar23 * (float)local_208._0_4_ + local_f8.x;
      IVar21.x = (float)local_168._0_4_;
      lVar1 = lVar13 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar20,iVar22,(ImVec2)local_1d8,IVar21,(ImU32)(&local_1c8.x)[lVar13],
                 (ImU32)(&local_1c8.y)[lVar13]);
      lVar13 = lVar1;
    } while (lVar1 != 6);
    fVar23 = cosf(((float)local_238._0_4_ + (float)local_238._0_4_) * 3.1415927);
    local_208._0_4_ = fVar23;
    fVar23 = sinf(((float)local_238._0_4_ + (float)local_238._0_4_) * 3.1415927);
    IVar8 = local_dc;
    local_1d8._0_4_ = fVar23;
    local_138._4_4_ = local_a8 * fVar23 * 0.5 + local_1ec.y;
    local_138._0_4_ = local_a8 * (float)local_208._0_4_ * 0.5 + local_1ec.x;
    if (local_228._0_1_ == '\0') {
      fVar23 = 0.55;
    }
    else {
      fVar23 = 0.65;
    }
    local_20c = local_20c * fVar23;
    iVar20 = 0x20;
    if ((int)(local_20c / 1.4) < 0x20) {
      iVar20 = (int)(local_20c / 1.4);
    }
    iVar22 = 9;
    if (9 < iVar20) {
      iVar22 = iVar20;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_138,local_20c,local_dc,iVar22);
    ImDrawList::AddCircle(this,(ImVec2 *)local_138,local_20c + 1.0,(ImU32)local_188,iVar22,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_138,local_20c,IVar16,iVar22,1.0);
    local_e8.x = (local_170.x * (float)local_208._0_4_ - (float)local_1d8._0_4_ * local_170.y) +
                 local_1ec.x;
    local_e8.y = local_170.x * (float)local_1d8._0_4_ + local_170.y * (float)local_208._0_4_ +
                 local_1ec.y;
    local_38.y = local_178.x * (float)local_1d8._0_4_ + local_178.y * (float)local_208._0_4_ +
                 local_1ec.y;
    local_38.x = (local_178.x * (float)local_208._0_4_ - (float)local_1d8._0_4_ * local_178.y) +
                 local_1ec.x;
    local_40.y = local_180.x * (float)local_1d8._0_4_ + (float)local_208._0_4_ * local_180.y +
                 local_1ec.y;
    local_40.x = (local_180.x * (float)local_208._0_4_ - (float)local_1d8._0_4_ * local_180.y) +
                 local_1ec.x;
    IVar21 = GetFontTexUvWhitePixel();
    uStack_200 = extraout_XMM0_Qb;
    local_208._0_4_ = IVar21.x;
    local_208._4_4_ = IVar21.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar6 = _local_208;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar3 + 1;
    this->_VtxWritePtr->pos = local_e8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar8;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar14 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar14;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar14;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar8;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar14 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar14;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar14;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar16;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar14 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar14;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar14;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_e8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar14 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar14;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar14;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = (ImU32)local_b0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar14 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar14;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar14;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_208 = auVar6;
    ImDrawList::AddTriangle(this,&local_e8,&local_38,&local_40,(ImU32)local_188,1.5);
    fVar23 = 1.0;
    if (local_230 <= 1.0) {
      fVar23 = local_230;
    }
    fVar23 = (float)(~-(uint)(local_230 < 0.0) & (uint)fVar23);
    fVar26 = (local_e8.x - local_40.x) * fVar23 + local_40.x;
    fVar24 = (local_e8.y - local_40.y) * fVar23 + local_40.y;
    fVar25 = 1.0 - local_22c;
    fVar23 = 1.0;
    if (fVar25 <= 1.0) {
      fVar23 = fVar25;
    }
    fVar23 = (float)(~-(uint)(fVar25 < 0.0) & (uint)fVar23);
    local_110.x = (local_38.x - fVar26) * fVar23 + fVar26;
    local_110.y = (local_38.y - fVar24) * fVar23 + fVar24;
    uVar19 = local_238._4_4_;
    IVar8 = local_18c;
  }
  if (local_224._0_1_ == '\0') {
    fVar23 = 6.0;
  }
  else {
    fVar23 = 10.0;
  }
  local_208._0_4_ = fVar23;
  ImDrawList::AddCircleFilled(this,&local_110,fVar23,IVar8,0xc);
  ImDrawList::AddCircle(this,&local_110,(float)local_208._0_4_ + 1.0,(ImU32)local_188,0xc,1.0);
  ImDrawList::AddCircle(this,&local_110,(float)local_208._0_4_,IVar16,0xc,1.0);
  if (local_184 == 0x10000) {
    fVar23 = local_220[1].y;
    _local_1d8 = ZEXT416((uint)fVar23);
    fVar24 = 1.0;
    if (fVar23 <= 1.0) {
      fVar24 = fVar23;
    }
    _local_208 = ZEXT416((uint)(1.0 - fVar24));
    local_138._8_4_ = local_128 + (float)local_108._0_4_;
    fStack_12c = local_1a8 + local_218.y;
    local_138._4_4_ = local_218.y;
    local_138._0_4_ = local_108._0_4_;
    p_max.y = fStack_12c;
    p_max.x = (float)local_138._8_4_;
    RenderColorRectWithAlphaCheckerboard
              (this,(ImVec2)local_138._0_8_,p_max,0,
               ((float)local_138._8_4_ - (float)local_108._0_4_) * 0.5,(ImVec2)0x0,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_138,(ImVec2 *)(local_138 + 8),IVar8,IVar8,IVar8 & 0xffffff,
               IVar8 & 0xffffff);
    local_208._4_4_ = (float)(int)(float)(~local_1d8._4_4_ & local_208._4_4_);
    local_208._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1d8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1d8._0_4_ < 0.0) & local_208._0_4_) * local_1a8 +
                      local_218.y + 0.5);
    uStack_200._0_4_ = (float)(int)(float)(~uStack_1d0 & (uint)(float)uStack_200);
    uStack_200._4_4_ = (uint)(float)(int)(float)(~uStack_1cc & uStack_200._4_4_);
    p_max_00.y = fStack_12c;
    p_max_00.x = (float)local_138._8_4_;
    RenderFrameBorder((ImVec2)local_138._0_8_,p_max_00,0.0);
    pos_00.x = (float)local_108._0_4_ + -1.0;
    pos_00.y = (float)local_208._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_128 + 2.0,(local_150->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar19 != '\0') {
    iVar20 = bcmp(local_58,local_220,local_b8);
    uVar19 = uVar19 & 0xff;
    if (iVar20 == 0) {
      uVar19 = 0;
    }
  }
  bVar15 = (byte)uVar19;
  if ((uVar19 & 1) != 0) {
    MarkItemEdited((local_150->LastItemData).ID);
  }
  PopID();
LAB_001f26af:
  return (bool)(bVar15 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}